

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

bool glcts::verifyImage<int,4u,3u,3u>(int *data,int *expected_values,GLuint n_layers)

{
  uint uVar1;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  GLuint cube_face;
  
  uVar1 = n_layers * 6;
  if (uVar1 == 0) {
    bVar4 = true;
  }
  else {
    bVar4 = false;
    bVar3 = verifyFace<int,4u,3u,3u>(data,0,expected_values,n_layers * 0x12);
    if (bVar3) {
      GVar2 = 1;
      do {
        cube_face = GVar2;
        if (uVar1 == cube_face) break;
        bVar4 = verifyFace<int,4u,3u,3u>(data,cube_face,expected_values,n_layers * 0x12);
        GVar2 = cube_face + 1;
      } while (bVar4);
      bVar4 = uVar1 <= cube_face;
    }
  }
  return bVar4;
}

Assistant:

bool verifyImage(const T* data, const T* expected_values, const glw::GLuint n_layers)
{
	static const glw::GLuint n_faces = 6;

	const glw::GLuint n_total_faces = n_layers * n_faces;

	for (glw::GLuint face = 0; face < n_total_faces; ++face)
	{
		if (false == verifyFace<T, N_Components, Width, Height>(data, face, expected_values, n_total_faces * Width))
		{
			return false;
		}
	}

	return true;
}